

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

bool leveldb::FindLargestKey
               (InternalKeyComparator *icmp,
               vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *files,
               InternalKey *largest_key)

{
  value_type pFVar1;
  bool bVar2;
  int iVar3;
  const_reference ppFVar4;
  FileMetaData *pFVar5;
  FileMetaData *f;
  size_t i;
  InternalKey *largest_key_local;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *files_local;
  InternalKeyComparator *icmp_local;
  
  bVar2 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::empty
                    (files);
  if (bVar2) {
    icmp_local._7_1_ = false;
  }
  else {
    ppFVar4 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
              operator[](files,0);
    InternalKey::operator=(largest_key,&(*ppFVar4)->largest);
    f = (FileMetaData *)0x1;
    while( true ) {
      pFVar5 = (FileMetaData *)
               std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::size
                         (files);
      if (pFVar5 <= f) break;
      ppFVar4 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
                operator[](files,(size_type)f);
      pFVar1 = *ppFVar4;
      iVar3 = InternalKeyComparator::Compare(icmp,&pFVar1->largest,largest_key);
      if (0 < iVar3) {
        InternalKey::operator=(largest_key,&pFVar1->largest);
      }
      f = (FileMetaData *)((long)&f->refs + 1);
    }
    icmp_local._7_1_ = true;
  }
  return icmp_local._7_1_;
}

Assistant:

bool FindLargestKey(const InternalKeyComparator& icmp,
                    const std::vector<FileMetaData*>& files,
                    InternalKey* largest_key) {
  if (files.empty()) {
    return false;
  }
  *largest_key = files[0]->largest;
  for (size_t i = 1; i < files.size(); ++i) {
    FileMetaData* f = files[i];
    if (icmp.Compare(f->largest, *largest_key) > 0) {
      *largest_key = f->largest;
    }
  }
  return true;
}